

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

uint8_t * __thiscall pstore::storage::address_to_raw_pointer(storage *this,address addr)

{
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  _Var1._M_head_impl =
       (this->sat_)._M_t.
       super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  uVar4 = (ulong)(((uint)(addr.a_ >> 0x16) & 0xffff) << 5);
  uVar2 = *(ulong *)((long)(_Var1._M_head_impl)->_M_elems + uVar4);
  lVar3 = *(long *)((long)(_Var1._M_head_impl)->_M_elems + uVar4 + 0x10);
  if ((uVar2 != 0 || lVar3 != 0) &&
     ((uVar2 < *(ulong *)(lVar3 + 8) ||
      (*(ulong *)(lVar3 + 8) + *(long *)(lVar3 + 0x28) < uVar2 + 0x400000)))) {
    assert_failed("e.is_valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x11f);
  }
  return (uint8_t *)(uVar2 + ((uint)addr.a_ & 0x3fffff));
}

Assistant:

std::uint8_t const * address_to_raw_pointer (address const addr) const noexcept {
            return address_to_raw_pointer_impl (*this, addr);
        }